

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * __thiscall
Catch::TestSpecParser::preprocessPattern_abi_cxx11_
          (string *__return_storage_ptr__,TestSpecParser *this)

{
  undefined8 *puVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 *puVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  bool bVar9;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  undefined8 *local_58;
  ulong local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (this->m_patternName)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (this->m_patternName)._M_string_length
            );
  puVar5 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar5) {
    uVar7 = 0;
    do {
      std::__cxx11::string::substr((ulong)&local_78,(ulong)__return_storage_ptr__);
      std::__cxx11::string::substr((ulong)&local_98,(ulong)__return_storage_ptr__);
      uVar8 = 0xf;
      if (local_78 != local_68) {
        uVar8 = local_68[0];
      }
      if (uVar8 < (ulong)(local_90 + local_70)) {
        uVar8 = 0xf;
        if (local_98 != local_88) {
          uVar8 = local_88[0];
        }
        if (uVar8 < (ulong)(local_90 + local_70)) goto LAB_0016be80;
        puVar4 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78);
      }
      else {
LAB_0016be80:
        puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
      }
      puVar1 = puVar4 + 2;
      if ((undefined8 *)*puVar4 == puVar1) {
        local_48 = *puVar1;
        uStack_40 = puVar4[3];
        local_58 = &local_48;
      }
      else {
        local_48 = *puVar1;
        local_58 = (undefined8 *)*puVar4;
      }
      local_50 = puVar4[1];
      *puVar4 = puVar1;
      puVar4[1] = 0;
      *(undefined1 *)puVar1 = 0;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
      if (local_58 != &local_48) {
        operator_delete(local_58);
      }
      if (local_98 != local_88) {
        operator_delete(local_98);
      }
      if (local_78 != local_68) {
        operator_delete(local_78);
      }
      uVar7 = uVar7 + 1;
      puVar5 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar6 = (this->m_escapeChars).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (uVar7 < (ulong)((long)puVar6 - (long)puVar5 >> 3));
  }
  if (puVar6 != puVar5) {
    (this->m_escapeChars).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5;
  }
  local_58 = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"exclude:","");
  if (__return_storage_ptr__->_M_string_length < local_50) {
    bVar9 = false;
  }
  else if (local_50 == 0) {
    bVar9 = true;
  }
  else {
    iVar3 = bcmp(local_58,(__return_storage_ptr__->_M_dataplus)._M_p,local_50);
    bVar9 = iVar3 == 0;
  }
  if (local_58 != &local_48) {
    operator_delete(local_58);
  }
  if (bVar9) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)&local_58,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
    if (local_58 != &local_48) {
      operator_delete(local_58);
    }
  }
  (this->m_patternName)._M_string_length = 0;
  *(this->m_patternName)._M_dataplus._M_p = '\0';
  this->m_realPatternPos = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string TestSpecParser::preprocessPattern() {
        std::string token = m_patternName;
        for (std::size_t i = 0; i < m_escapeChars.size(); ++i)
            token = token.substr(0, m_escapeChars[i] - i) + token.substr(m_escapeChars[i] - i + 1);
        m_escapeChars.clear();
        if (startsWith(token, "exclude:")) {
            m_exclusion = true;
            token = token.substr(8);
        }

        m_patternName.clear();
        m_realPatternPos = 0;

        return token;
    }